

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testorder.cpp
# Opt level: O0

int main(void)

{
  uint32_t uVar1;
  char *pcVar2;
  char *np;
  char *hp;
  long n;
  long h;
  int big;
  
  uVar1 = htonl(0x10000);
  printf("Your system represents 2^16 as:   %x:%x:%x:%x\n",0,0,1,0);
  printf("Network Order represents 2^16 as: %x:%x:%x:%x\n",0,0,1,0);
  pcVar2 = "Little";
  if (uVar1 != 0) {
    pcVar2 = "Big";
  }
  printf("\nYou are using %s Endian.\n",pcVar2);
  return uVar1;
}

Assistant:

int
main(void)
{
  int big;
  long h, n;
  char *hp, *np;
  h = 65536;
  n = htonl(h);
  hp = (char *)&h;
  np = (char *)&n;
  printf("Your system represents 2^16 as:   %x:%x:%x:%x\n", hp[0], hp[1], hp[2],
         hp[3]);
  printf("Network Order represents 2^16 as: %x:%x:%x:%x\n", hp[0], hp[1], hp[2],
         hp[3]);
  big = (h = n);
  printf("\nYou are using %s Endian.\n", (big ? "Big" : "Little"));
  return big;
}